

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_LinkedModel_2eproto::TableStruct::InitDefaultsImpl(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/LinkedModel.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  protobuf_Parameters_2eproto::InitDefaults();
  LinkedModel::LinkedModel((LinkedModel *)&_LinkedModel_default_instance_);
  DAT_00352ef0 = 1;
  LinkedModelFile::LinkedModelFile((LinkedModelFile *)&_LinkedModelFile_default_instance_);
  DAT_00352f28 = 1;
  DAT_00352f10 = &_StringParameter_default_instance_;
  DAT_00352f18 = &_StringParameter_default_instance_;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::CoreML::Specification::protobuf_Parameters_2eproto::InitDefaults();
  _LinkedModel_default_instance_.DefaultConstruct();
  _LinkedModelFile_default_instance_.DefaultConstruct();
  _LinkedModelFile_default_instance_.get_mutable()->linkedmodelfilename_ = const_cast< ::CoreML::Specification::StringParameter*>(
      ::CoreML::Specification::StringParameter::internal_default_instance());
  _LinkedModelFile_default_instance_.get_mutable()->linkedmodelsearchpath_ = const_cast< ::CoreML::Specification::StringParameter*>(
      ::CoreML::Specification::StringParameter::internal_default_instance());
}